

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::remap_shader_module_handles<VkGraphicsPipelineCreateInfo>
          (Impl *this,VkGraphicsPipelineCreateInfo *info)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  
  uVar4 = 0xffffffffffffffff;
  lVar3 = 0;
  do {
    uVar1 = info->stageCount;
    uVar4 = uVar4 + 1;
    if (uVar1 <= uVar4) break;
    bVar2 = remap_shader_module_handle
                      (this,(VkPipelineShaderStageCreateInfo *)((long)&info->pStages->sType + lVar3)
                      );
    lVar3 = lVar3 + 0x30;
  } while (bVar2);
  return uVar1 <= uVar4;
}

Assistant:

bool StateRecorder::Impl::remap_shader_module_handles(CreateInfo *info)
{
	for (uint32_t i = 0; i < info->stageCount; i++)
	{
		auto &stage = const_cast<VkPipelineShaderStageCreateInfo &>(info->pStages[i]);
		if (!remap_shader_module_handle(stage))
			return false;
	}

	return true;
}